

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O1

void __thiscall FrozenCleanupCheck::~FrozenCleanupCheck(FrozenCleanupCheck *this)

{
  long in_FS_OFFSET;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->should_freeze == true) {
    local_28._M_device = &m;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    nFrozen.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    std::condition_variable::notify_one();
    while (nFrozen.super___atomic_base<unsigned_long>._M_i != 0) {
      std::condition_variable::wait((unique_lock *)cv);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~FrozenCleanupCheck()
    {
        if (should_freeze) {
            std::unique_lock<std::mutex> l(m);
            nFrozen.store(1, std::memory_order_relaxed);
            cv.notify_one();
            cv.wait(l, []{ return nFrozen.load(std::memory_order_relaxed) == 0;});
        }
    }